

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O2

int quicly_local_cid_on_lost(quicly_local_cid_set_t *set,uint64_t sequence)

{
  size_t idx;
  bool bVar1;
  
  idx = find_index(set,sequence);
  if ((idx == 0xffffffffffffffff) || (set->cids[idx].state == QUICLY_LOCAL_CID_STATE_DELIVERED)) {
    bVar1 = set->cids[0].state == QUICLY_LOCAL_CID_STATE_PENDING;
  }
  else {
    do_mark_pending(set,idx);
    bVar1 = true;
  }
  return (int)bVar1;
}

Assistant:

int quicly_local_cid_on_lost(quicly_local_cid_set_t *set, uint64_t sequence)
{
    size_t i = find_index(set, sequence);
    if (i == SIZE_MAX)
        return has_pending(set);

    /* if it's already delivered, ignore the packet loss event (no need for retransmission) */
    if (set->cids[i].state == QUICLY_LOCAL_CID_STATE_DELIVERED)
        return has_pending(set);

    do_mark_pending(set, i);

    return 1;
}